

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O1

UniquePtr<struct_stack_st_CRYPTO_BUFFER> __thiscall
bssl::SSL_parse_CA_list(bssl *this,SSL *ssl,uint8_t *out_alert,CBS *cbs)

{
  CRYPTO_BUFFER_POOL *pool;
  char cVar1;
  int iVar2;
  CRYPTO_BUFFER *p;
  size_t sVar3;
  bool bVar4;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> ret;
  UniquePtr<CRYPTO_BUFFER> buffer;
  CBS child;
  CBS distinguished_name;
  _Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false> local_70;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_68;
  uint8_t *local_60;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_58;
  CBS local_50;
  CBS local_40;
  
  pool = ((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->pool;
  local_70._M_head_impl = (stack_st_CRYPTO_BUFFER *)OPENSSL_sk_new_null();
  if ((OPENSSL_STACK *)local_70._M_head_impl == (OPENSSL_STACK *)0x0) {
    *out_alert = 'P';
  }
  else {
    local_60 = out_alert;
    iVar2 = CBS_get_u16_length_prefixed(cbs,&local_50);
    if (iVar2 == 0) {
      *local_60 = '2';
      ERR_put_error(0x10,0,0xa2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                    ,0x184);
    }
    else {
      if (local_50.len != 0) {
        do {
          iVar2 = CBS_get_u16_length_prefixed(&local_50,&local_40);
          if (iVar2 == 0) {
            *local_60 = '2';
            ERR_put_error(0x10,0,0x7b,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                          ,0x18c);
            goto LAB_0025dc65;
          }
          p = CRYPTO_BUFFER_new_from_CBS(&local_40,pool);
          if (p == (CRYPTO_BUFFER *)0x0) {
            bVar4 = true;
            local_68._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
                 (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>)0x0;
          }
          else {
            local_68._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
                 (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>)0x0;
            local_58._M_head_impl = p;
            sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)local_70._M_head_impl,p);
            bVar4 = sVar3 == 0;
            if (!bVar4) {
              local_58._M_head_impl = (CRYPTO_BUFFER *)0x0;
            }
          }
          if (p != (CRYPTO_BUFFER *)0x0) {
            std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_58);
          }
          if (bVar4) {
            *local_60 = 'P';
            *(undefined8 *)this = 0;
            std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_68);
            goto LAB_0025dc6c;
          }
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_68);
        } while (local_50.len != 0);
      }
      cVar1 = (*((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->
                check_CA_list)(local_70._M_head_impl);
      if ((bool)cVar1) {
        *(stack_st_CRYPTO_BUFFER **)this = local_70._M_head_impl;
        local_70._M_head_impl = (stack_st_CRYPTO_BUFFER *)0x0;
        goto LAB_0025dc6c;
      }
      *local_60 = '2';
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                    ,0x19b);
    }
  }
LAB_0025dc65:
  *(undefined8 *)this = 0;
LAB_0025dc6c:
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&local_70);
  return (__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<STACK_OF(CRYPTO_BUFFER)> SSL_parse_CA_list(SSL *ssl,
                                                     uint8_t *out_alert,
                                                     CBS *cbs) {
  CRYPTO_BUFFER_POOL *const pool = ssl->ctx->pool;

  UniquePtr<STACK_OF(CRYPTO_BUFFER)> ret(sk_CRYPTO_BUFFER_new_null());
  if (!ret) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return nullptr;
  }

  CBS child;
  if (!CBS_get_u16_length_prefixed(cbs, &child)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_LENGTH_MISMATCH);
    return nullptr;
  }

  while (CBS_len(&child) > 0) {
    CBS distinguished_name;
    if (!CBS_get_u16_length_prefixed(&child, &distinguished_name)) {
      *out_alert = SSL_AD_DECODE_ERROR;
      OPENSSL_PUT_ERROR(SSL, SSL_R_CA_DN_TOO_LONG);
      return nullptr;
    }

    UniquePtr<CRYPTO_BUFFER> buffer(
        CRYPTO_BUFFER_new_from_CBS(&distinguished_name, pool));
    if (!buffer ||  //
        !PushToStack(ret.get(), std::move(buffer))) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return nullptr;
    }
  }

  if (!ssl->ctx->x509_method->check_CA_list(ret.get())) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return nullptr;
  }

  return ret;
}